

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O3

bool __thiscall pg::DTLSolver::extractTangles(DTLSolver *this,int startvertex,bitset *R,int *str)

{
  pointer *pppiVar1;
  ulong *puVar2;
  vector<int,std::allocator<int>> *this_00;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  uint64_t *puVar6;
  uint64_t *puVar7;
  size_t sVar8;
  pointer ppiVar9;
  pointer piVar10;
  pointer piVar11;
  iterator iVar12;
  char cVar13;
  bool bVar14;
  bool bVar15;
  ulong uVar16;
  Game *pGVar17;
  pointer ppiVar18;
  ostream *poVar19;
  int *piVar20;
  undefined7 extraout_var;
  Error *this_01;
  byte bVar21;
  int iVar22;
  uint *puVar23;
  int *piVar24;
  long lVar25;
  ulong uVar26;
  int *piVar27;
  int *extraout_RDX;
  iterator iVar28;
  ulong uVar29;
  uint *puVar30;
  uint uVar31;
  int *v_1;
  uint64_t *puVar32;
  uint uVar33;
  uint uVar34;
  uint *puVar35;
  int *_tout;
  int pr;
  int tidx;
  vector<int,_std::allocator<int>_> *__range5;
  int *_vv;
  _label_vertex local_a8;
  int local_94;
  uint64_t *local_90;
  undefined8 local_88;
  int local_80;
  int local_7c;
  vector<int,std::allocator<int>> *local_78;
  vector<int,std::allocator<int>> *local_70;
  vector<int*,std::allocator<int*>> *local_68;
  vector<int,std::allocator<int>> *local_60;
  vector<int*,std::allocator<int*>> *local_58;
  bitset *local_50;
  uint64_t *local_48;
  Game *local_40;
  int *local_38;
  
  uVar16 = (ulong)startvertex;
  local_94 = ((this->super_Solver).game)->_priority[uVar16];
  iVar22 = (this->pea_vS).pointer;
  (this->pea_vS).pointer = iVar22 + 1;
  (this->pea_vS).queue[iVar22] = startvertex;
  iVar22 = (this->pea_iS).pointer;
  (this->pea_iS).pointer = iVar22 + 1;
  (this->pea_iS).queue[iVar22] = 0;
  puVar2 = (this->pea_root)._bits + (uVar16 >> 6);
  *puVar2 = *puVar2 | 1L << (uVar16 & 0x3f);
  uVar34 = this->pea_curidx;
  this->pea_curidx = uVar34 + 1;
  this->pea_vidx[uVar16] = uVar34;
  if ((this->pea_vS).pointer == 0) {
    local_88 = 0;
  }
  else {
    local_58 = (vector<int*,std::allocator<int*>> *)&this->tv;
    local_60 = (vector<int,std::allocator<int>> *)&this->tpr;
    local_70 = (vector<int,std::allocator<int>> *)&this->tangle;
    local_88 = 0;
    local_68 = (vector<int*,std::allocator<int*>> *)&this->tout;
    local_78 = (vector<int,std::allocator<int>> *)&this->dom_vector;
    local_80 = local_94;
    local_50 = R;
    do {
      local_40 = (this->super_Solver).game;
      local_90 = (this->pea_root)._bits;
      puVar35 = (this->pea_vS).queue;
      puVar5 = (this->pea_iS).queue;
      puVar30 = this->pea_vidx;
      local_48 = (local_40->_owner)._bits;
      puVar32 = local_50->_bits;
LAB_0017401e:
      lVar25 = (long)(this->pea_iS).pointer;
      uVar34 = puVar35[(long)(this->pea_vS).pointer + -1];
      uVar16 = (ulong)uVar34;
      uVar31 = puVar5[lVar25 + -1];
      bVar21 = (byte)uVar34;
      if ((((local_48[(ulong)(long)(int)uVar34 >> 6] >> (uVar16 & 0x3f) & 1) == 0 ^ (byte)local_80)
          & 1) == 0) {
        iVar22 = local_40->_firstouts[(int)uVar34];
        piVar27 = local_40->_outedges;
        if (((ulong)uVar31 != 0) &&
           (puVar30[piVar27[(long)iVar22 + (ulong)(uVar31 - 1)]] < puVar30[uVar16])) {
          puVar30[uVar16] = puVar30[piVar27[(long)iVar22 + (ulong)(uVar31 - 1)]];
          local_90[uVar34 >> 6] =
               local_90[uVar34 >> 6] &
               (-2L << (bVar21 & 0x3f) | 0xfffffffffffffffeU >> 0x40 - (bVar21 & 0x3f));
        }
        uVar33 = piVar27[(long)iVar22 + (ulong)uVar31];
        if (uVar33 != 0xffffffff) {
          puVar23 = this->pea_vidx;
          puVar6 = (this->pea_root)._bits;
          do {
            uVar31 = uVar31 + 1;
            uVar29 = (ulong)(int)uVar33;
            uVar26 = uVar29 >> 6;
            if ((puVar32[uVar26] >> (uVar29 & 0x3f) & 1) != 0) {
              uVar3 = puVar23[uVar29];
              if (uVar3 == 0) goto LAB_00174173;
              if (uVar3 < puVar23[uVar16]) {
                puVar23[uVar16] = uVar3;
                puVar2 = puVar6 + (uVar34 >> 6);
                *puVar2 = *puVar2 & (-2L << (bVar21 & 0x3f) |
                                    0xfffffffffffffffeU >> 0x40 - (bVar21 & 0x3f));
              }
            }
            uVar33 = piVar27[(long)iVar22 + (ulong)uVar31];
            if (uVar33 == 0xffffffff) break;
          } while( true );
        }
      }
      else {
        uVar33 = str[uVar16];
        uVar29 = (ulong)(int)uVar33;
        uVar3 = puVar30[uVar29];
        if (uVar31 == 0 && uVar3 == 0) {
          puVar5[lVar25 + -1] = 1;
          puVar23 = puVar30 + uVar29;
          iVar22 = (this->pea_vS).pointer;
          (this->pea_vS).pointer = iVar22 + 1;
          puVar35[iVar22] = uVar33;
          iVar22 = (this->pea_iS).pointer;
          (this->pea_iS).pointer = iVar22 + 1;
          puVar5[iVar22] = 0;
          uVar26 = uVar29 >> 6;
          goto LAB_001741d3;
        }
        if (uVar3 < puVar30[uVar16]) {
          puVar30[uVar16] = uVar3;
          puVar2 = (this->pea_root)._bits + (uVar34 >> 6);
          *puVar2 = *puVar2 & (-2L << (bVar21 & 0x3f) |
                              0xfffffffffffffffeU >> 0x40 - (bVar21 & 0x3f));
        }
      }
      piVar27 = &(this->pea_vS).pointer;
      *piVar27 = *piVar27 + -1;
      piVar27 = &(this->pea_iS).pointer;
      *piVar27 = *piVar27 + -1;
      if (((this->pea_root)._bits[uVar34 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
        iVar22 = (this->pea_S).pointer;
        (this->pea_S).pointer = iVar22 + 1;
        (this->pea_S).queue[iVar22] = uVar34;
      }
      else {
        this->pea_curidx = this->pea_curidx + -1;
        local_a8.g = (Game *)CONCAT44(local_a8.g._4_4_,uVar34);
        iVar28._M_current =
             (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar28._M_current ==
            (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_70,iVar28,(int *)&local_a8);
        }
        else {
          *iVar28._M_current = uVar34;
          (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar28._M_current + 1;
        }
        iVar22 = (this->pea_S).pointer;
        while (iVar22 != 0) {
          uVar33 = (this->pea_S).queue[(long)iVar22 + -1];
          local_a8.g._4_4_ = (undefined4)((ulong)local_a8.g >> 0x20);
          local_a8.g = (Game *)CONCAT44(local_a8.g._4_4_,uVar33);
          puVar30 = this->pea_vidx;
          if (puVar30[(int)uVar33] < puVar30[uVar16]) break;
          (this->pea_S).pointer = iVar22 + -1;
          this->pea_curidx = this->pea_curidx + -1;
          puVar30[(int)uVar33] = 0xffffffff;
          iVar28._M_current =
               (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar28._M_current ==
              (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_70,iVar28,(int *)&local_a8);
          }
          else {
            *iVar28._M_current = uVar33;
            (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar28._M_current + 1;
          }
          iVar22 = (this->pea_S).pointer;
        }
        this->pea_vidx[uVar16] = 0xffffffff;
        piVar20 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        piVar27 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pGVar17 = (Game *)((long)piVar20 - (long)piVar27);
        if (pGVar17 < (Game *)0x5) {
          uVar31 = str[uVar16];
          pGVar17 = (Game *)(ulong)uVar31;
          if (uVar31 != uVar34) {
            if (uVar31 == 0xffffffff) {
              bVar15 = Game::has_edge((this->super_Solver).game,uVar34,uVar34);
              pGVar17 = (Game *)CONCAT71(extraout_var,bVar15);
              piVar27 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              piVar20 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              if (bVar15) goto LAB_00174364;
            }
            if (piVar20 != piVar27) {
              (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = piVar27;
            }
            goto LAB_00174d0f;
          }
        }
LAB_00174364:
        if (piVar27 != piVar20) {
          pGVar17 = (Game *)(this->escapes)._bits;
          piVar24 = piVar27;
          do {
            iVar22 = *piVar24;
            piVar24 = piVar24 + 1;
            (&pGVar17->n_vertices)[(ulong)(long)iVar22 >> 6] =
                 (&pGVar17->n_vertices)[(ulong)(long)iVar22 >> 6] | 1L << ((long)iVar22 & 0x3fU);
          } while (piVar24 != piVar20);
          if (piVar27 != piVar20) {
            pGVar17 = (this->super_Solver).game;
            puVar32 = (this->G)._bits;
            puVar6 = (pGVar17->_owner)._bits;
            piVar24 = piVar27;
            do {
              uVar16 = (ulong)*piVar24;
              if ((((puVar6[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0 ^ (byte)local_80) & 1) == 0) {
                uVar34 = pGVar17->_outedges[pGVar17->_firstouts[uVar16]];
                if (uVar34 != 0xffffffff) {
                  puVar35 = (this->tangleto).queue;
                  puVar7 = (this->escapes)._bits;
                  puVar30 = (uint *)(pGVar17->_outedges + (long)pGVar17->_firstouts[uVar16] + 1);
                  do {
                    uVar16 = (ulong)(long)(int)uVar34 >> 6;
                    if ((puVar32[uVar16] >> ((ulong)uVar34 & 0x3f) & 1) != 0) {
                      uVar29 = puVar7[uVar16];
                      uVar26 = 1L << ((ulong)uVar34 & 0x3f);
                      if ((uVar29 & uVar26) == 0) {
                        puVar7[uVar16] = uVar29 | uVar26;
                        iVar22 = (this->tangleto).pointer;
                        (this->tangleto).pointer = iVar22 + 1;
                        puVar35[iVar22] = uVar34;
                      }
                    }
                    uVar34 = *puVar30;
                    puVar30 = puVar30 + 1;
                  } while (uVar34 != 0xffffffff);
                }
              }
              piVar24 = piVar24 + 1;
            } while (piVar24 != piVar20);
          }
        }
        sVar8 = (this->escapes)._bitssize;
        if (sVar8 != 0) {
          pGVar17 = (Game *)memset((this->escapes)._bits,0,sVar8 << 3);
        }
        if ((this->tangleto).pointer == 0) {
          if ((this->super_Solver).trace != 0) {
            poVar19 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar19,"\x1b[1;38;5;201mdominion \x1b[36m",0x1b);
            poVar19 = (ostream *)std::ostream::operator<<(poVar19,local_94);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
            poVar19 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar19," (depth ",8);
            poVar19 = (ostream *)std::ostream::operator<<(poVar19,this->cur_depth);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,")",1);
            if (this->cur_depth != 0) {
              this_01 = (Error *)__cxa_allocate_exception(0x40);
              Error::Error(this_01,"logic error",
                           "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/dtl.cpp"
                           ,0x161);
              __cxa_throw(this_01,&Error::typeinfo,Error::~Error);
            }
            if (1 < (this->super_Solver).trace) {
              local_90 = (uint64_t *)
                         (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              puVar32 = (uint64_t *)
                        (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if (puVar32 != local_90) {
                do {
                  poVar19 = (this->super_Solver).logger;
                  iVar22 = (int)*puVar32;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar19," \x1b[1;36m",8);
                  local_a8.g = (this->super_Solver).game;
                  local_a8.v = iVar22;
                  poVar19 = operator<<(poVar19,&local_a8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
                  if (str[iVar22] != -1) {
                    poVar19 = (this->super_Solver).logger;
                    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"->",2);
                    local_a8.v = str[iVar22];
                    local_a8.g = (this->super_Solver).game;
                    operator<<(poVar19,&local_a8);
                  }
                  puVar32 = (uint64_t *)((long)puVar32 + 4);
                } while (puVar32 != local_90);
              }
            }
            poVar19 = (this->super_Solver).logger;
            cVar13 = (char)poVar19;
            std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + cVar13);
            std::ostream::put(cVar13);
            pGVar17 = (Game *)std::ostream::flush();
          }
          puVar35 = (uint *)(this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
          puVar5 = (uint *)(this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
          if (puVar35 != puVar5) {
            do {
              uVar33 = *puVar35;
              uVar29 = (ulong)(int)uVar33;
              local_a8.g = (Game *)CONCAT44(local_a8.g._4_4_,uVar33);
              piVar27 = (int *)(uVar29 >> 6);
              puVar32 = (this->S)._bits;
              uVar16 = puVar32[(long)piVar27];
              if ((uVar16 >> (uVar29 & 0x3f) & 1) == 0) {
                puVar32[(long)piVar27] = uVar16 | 1L << (uVar29 & 0x3f);
                iVar22 = (this->SQ).pointer;
                (this->SQ).pointer = iVar22 + 1;
                (this->SQ).queue[iVar22] = uVar33;
                iVar28._M_current =
                     (this->dom_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                piVar20 = (this->dom_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
                if (iVar28._M_current == piVar20) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (local_78,iVar28,(int *)&local_a8);
                  iVar28._M_current =
                       (this->dom_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  piVar20 = (this->dom_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage;
                  uVar33 = (uint)local_a8.g;
                }
                else {
                  *iVar28._M_current = uVar33;
                  iVar28._M_current = iVar28._M_current + 1;
                  (this->dom_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar28._M_current;
                }
                piVar27 = str + (int)uVar33;
                if (iVar28._M_current == piVar20) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (local_78,iVar28,piVar27);
                  piVar27 = extraout_RDX;
                }
                else {
                  *iVar28._M_current = *piVar27;
                  (this->dom_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar28._M_current + 1;
                }
              }
              puVar35 = puVar35 + 1;
            } while (puVar35 != puVar5);
            piVar10 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar11 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            this->dominions = this->dominions + 1;
            local_88 = CONCAT71((int7)((ulong)piVar27 >> 8),1);
            if (piVar11 != piVar10) {
              (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = piVar10;
            }
            goto LAB_00174d0f;
          }
          this->dominions = this->dominions + 1;
        }
        else {
          if (piVar27 != piVar20) {
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (piVar27,piVar20,(int)LZCOUNT((long)piVar20 - (long)piVar27 >> 2) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (piVar27,piVar20);
            piVar27 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar20 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          ppiVar18 = (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppiVar9 = (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (ppiVar18 != ppiVar9) {
            bVar14 = false;
            bVar15 = false;
            uVar16 = (ulong)((long)piVar20 - (long)piVar27) >> 2;
            iVar22 = (int)uVar16;
            do {
              if (iVar22 == 0) {
                uVar29 = 0;
              }
              else {
                uVar26 = 0;
                do {
                  if ((*ppiVar18)[uVar26 * 2] != piVar27[uVar26]) goto LAB_00174525;
                  uVar26 = uVar26 + 1;
                  uVar29 = (ulong)(uint)(iVar22 * 2);
                } while ((uVar16 & 0xffffffff) != uVar26);
              }
              bVar15 = bVar14;
              if ((*ppiVar18)[uVar29] == -1) {
                bVar14 = true;
                bVar15 = true;
              }
LAB_00174525:
            } while ((!bVar15) && (ppiVar18 = ppiVar18 + 1, ppiVar18 != ppiVar9));
            if (bVar15) {
              if (0 < (this->super_Solver).trace) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((this->super_Solver).logger,"\x1b[1;38;5;198mduplicate tangle\x1b[m",0x20
                          );
                if (1 < (this->super_Solver).trace) {
                  piVar20 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                  for (piVar27 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start; piVar27 != piVar20;
                      piVar27 = piVar27 + 1) {
                    poVar19 = (this->super_Solver).logger;
                    std::__ostream_insert<char,std::char_traits<char>>(poVar19," \x1b[1;36m",8);
                    local_a8.v = *piVar27;
                    local_a8.g = (this->super_Solver).game;
                    poVar19 = operator<<(poVar19,&local_a8);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
                    if (str[*piVar27] != -1) {
                      poVar19 = (this->super_Solver).logger;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar19,"->",2);
                      local_a8.g = (this->super_Solver).game;
                      local_a8.v = str[*piVar27];
                      operator<<(poVar19,&local_a8);
                    }
                  }
                }
                poVar19 = (this->super_Solver).logger;
                cVar13 = (char)poVar19;
                std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + cVar13);
                std::ostream::put(cVar13);
                std::ostream::flush();
              }
              piVar10 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if ((this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish != piVar10) {
                (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = piVar10;
              }
              (this->tangleto).pointer = 0;
              goto LAB_00174d0f;
            }
          }
          if (0 < (this->super_Solver).trace) {
            poVar19 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar19,"\x1b[1;38;5;198mnew tangle ",0x18);
            poVar19 = (ostream *)std::ostream::operator<<(poVar19,local_94);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m (",5);
            poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,")",1);
            poVar19 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar19," (depth ",8);
            poVar19 = (ostream *)std::ostream::operator<<(poVar19,this->cur_depth);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,")",1);
            if (1 < (this->super_Solver).trace) {
              local_90 = (uint64_t *)
                         (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              puVar32 = (uint64_t *)
                        (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if (puVar32 != local_90) {
                do {
                  poVar19 = (this->super_Solver).logger;
                  iVar22 = (int)*puVar32;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar19," \x1b[1;36m",8);
                  local_a8.g = (this->super_Solver).game;
                  local_a8.v = iVar22;
                  poVar19 = operator<<(poVar19,&local_a8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
                  if (str[iVar22] != -1) {
                    poVar19 = (this->super_Solver).logger;
                    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"->",2);
                    local_a8.v = str[iVar22];
                    local_a8.g = (this->super_Solver).game;
                    operator<<(poVar19,&local_a8);
                  }
                  puVar32 = (uint64_t *)((long)puVar32 + 4);
                } while (puVar32 != local_90);
              }
            }
            poVar19 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar19," with ",6);
            poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19," escape vertices.",0x11);
            poVar19 = (this->super_Solver).logger;
            cVar13 = (char)poVar19;
            std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + cVar13);
            std::ostream::put(cVar13);
            std::ostream::flush();
          }
          local_7c = (int)((ulong)((long)(this->tpr).super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->tpr).super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 2);
          if ((this->tangleto).pointer == 0) {
            uVar34 = 0;
          }
          else {
            uVar16 = 0;
            do {
              this_00 = (vector<int,std::allocator<int>> *)
                        (this->tin + (this->tangleto).queue[uVar16]);
              iVar28._M_current = *(int **)(this_00 + 8);
              if (iVar28._M_current == *(int **)(this_00 + 0x10)) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (this_00,iVar28,&local_7c);
              }
              else {
                *iVar28._M_current = local_7c;
                *(int **)(this_00 + 8) = iVar28._M_current + 1;
              }
              uVar34 = (this->tangleto).pointer;
              uVar16 = uVar16 + 1;
            } while (uVar16 < uVar34);
          }
          local_a8.g = (Game *)operator_new__((ulong)(uVar34 + 1) << 2);
          if (uVar34 != 0) {
            puVar35 = (this->tangleto).queue;
            uVar16 = (ulong)uVar34 + 1;
            lVar25 = 0;
            do {
              uVar16 = uVar16 - 1;
              *(undefined4 *)((long)&(local_a8.g)->n_vertices + lVar25) =
                   *(undefined4 *)((long)puVar35 + lVar25);
              lVar25 = lVar25 + 4;
            } while (1 < uVar16);
          }
          *(int *)((long)&(local_a8.g)->n_vertices + (ulong)uVar34 * 4) = -1;
          iVar12._M_current =
               (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar12._M_current ==
              (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*const&>
                      (local_68,iVar12,(int **)&local_a8);
          }
          else {
            *iVar12._M_current = (int *)local_a8.g;
            pppiVar1 = &(this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppiVar1 = *pppiVar1 + 1;
          }
          piVar27 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          piVar20 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_38 = (int *)operator_new__(-(ulong)(((long)piVar27 - (long)piVar20 >> 2 &
                                                    0x6000000000000000U) != 0) |
                                           ((long)piVar27 - (long)piVar20) * 2 + 4U);
          if (piVar27 == piVar20) {
            uVar16 = 0;
          }
          else {
            piVar24 = local_38 + 1;
            iVar22 = 0;
            do {
              iVar4 = *piVar20;
              piVar20 = piVar20 + 1;
              iVar22 = iVar22 + -2;
              piVar24[-1] = iVar4;
              *piVar24 = str[iVar4];
              piVar24 = piVar24 + 2;
            } while (piVar20 != piVar27);
            uVar16 = (ulong)(uint)-iVar22;
          }
          local_38[uVar16] = -1;
          iVar12._M_current =
               (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar12._M_current ==
              (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*const&>
                      (local_58,iVar12,&local_38);
          }
          else {
            *iVar12._M_current = local_38;
            pppiVar1 = &(this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppiVar1 = *pppiVar1 + 1;
          }
          iVar28._M_current =
               (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar28._M_current ==
              (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_60,iVar28,&local_94);
          }
          else {
            *iVar28._M_current = local_94;
            (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar28._M_current + 1;
          }
          this->tangles = this->tangles + 1;
          pGVar17 = (Game *)(this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
          if ((Game *)(this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish != pGVar17) {
            (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)pGVar17;
          }
          (this->tangleto).pointer = 0;
        }
        local_88 = CONCAT71((int7)((ulong)pGVar17 >> 8),1);
      }
LAB_00174d0f:
    } while ((this->pea_vS).pointer != 0);
  }
  (this->pea_S).pointer = 0;
  return (bool)((byte)local_88 & 1);
LAB_00174173:
  puVar23 = puVar23 + uVar29;
  puVar5[(long)(this->pea_iS).pointer + -1] = uVar31;
  iVar22 = (this->pea_vS).pointer;
  (this->pea_vS).pointer = iVar22 + 1;
  puVar35[iVar22] = uVar33;
  iVar22 = (this->pea_iS).pointer;
  (this->pea_iS).pointer = iVar22 + 1;
  puVar5[iVar22] = 0;
LAB_001741d3:
  local_90[uVar26] = local_90[uVar26] | 1L << (uVar29 & 0x3f);
  uVar34 = this->pea_curidx;
  this->pea_curidx = uVar34 + 1;
  *puVar23 = uVar34;
  goto LAB_0017401e;
}

Assistant:

bool
DTLSolver::extractTangles(int startvertex, bitset &R, int *str)
{
    bool new_tangles = false;
    const int pr = priority(startvertex);
    const int pl = pr&1;

    /**
     * The following is the nonrecursive implementation of David Pearce,
     * "A space-efficient algorithm for finding strongly connected components" (IPL, 2016),
     * modified to on-the-fly restrict the graph by <R> and <str>.
     */

    // beginVisiting
    pea_vS.push(startvertex);
    pea_iS.push(0);
    pea_root[startvertex] = true;
    pea_vidx[startvertex] = pea_curidx++;
    while (pea_vS.nonempty()) {
pearce_again:
        // visitLoop
        const unsigned int n = pea_vS.back();
        unsigned int i = pea_iS.back();

        if (owner(n) != pl) {
            auto edges = outs(n);
            if (i>0) {
                // finishEdge
                const int w = edges[i-1];
                if (pea_vidx[w] < pea_vidx[n]) {
                    pea_vidx[n] = pea_vidx[w];
                    pea_root[n] = false;
                }
            }
            for (;;) {
                const int to = edges[i];
                if (to == -1) break; // done
                // beginEdge
                if (R[to]) {
                    if (pea_vidx[to] == 0) {
                        pea_iS.back() = i+1;
                        // beginVisiting
                        pea_vS.push(to);
                        pea_iS.push(0);
                        pea_root[to] = true;
                        pea_vidx[to] = pea_curidx++;
                        goto pearce_again; // break; continue;
                    } else {
                        // finishEdge
                        if (pea_vidx[to] < pea_vidx[n]) {
                            pea_vidx[n] = pea_vidx[to];
                            pea_root[n] = false;
                        }
                    }
                }
                i++;
            }
        } else {
            const int s = str[n];
            if (i == 0) {
                // beginEdge
                if (pea_vidx[s] == 0) {
                    pea_iS.back() = 1;
                    // beginVisiting
                    pea_vS.push(s);
                    pea_iS.push(0);
                    pea_root[s] = true;
                    pea_vidx[s] = pea_curidx++;
                    goto pearce_again; // break; continue;
                }
            }
            // finishEdge
            if (pea_vidx[s] < pea_vidx[n]) {
                pea_vidx[n] = pea_vidx[s];
                pea_root[n] = false;
            }
        }
        // finishVisiting
        pea_vS.pop();
        pea_iS.pop();
        if (pea_root[n]) {
            pea_curidx -= 1;
            tangle.push_back(n);
            while (pea_S.nonempty()) {
                const int t = pea_S.back();
                if (pea_vidx[n]>pea_vidx[t]) break;
                pea_S.pop();
                pea_curidx -= 1;
                pea_vidx[t] = (unsigned int)-1;
                tangle.push_back(t);
            }
            pea_vidx[n] = (unsigned int)-1;
        } else {
            pea_S.push(n);
            continue;
        }

        /**
         * End of Pearce's algorithm.
         * At this point, we have an SCC in <tangle>.
         *
         * Now check if the SCC is nontrivial, i.e., contains a cycle, i.e., either 2+ vertices
         * or a self-loop.
         */

        const bool is_tangle = (tangle.size() > 1) or
            ((unsigned int)str[n] == n) or
            (str[n] == -1 and game.has_edge(n, n));
        if (!is_tangle) {
            tangle.clear();
            continue;
        }

        /**
         * We have a tangle. Compute the outgoing edges (into <tangleto>) and the next highest region.
         */

        for (const int v : tangle) escapes[v] = true;

        for (const int v : tangle) {
            if (owner(v) != pl) {
                for (auto curedge = outs(v); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (G[to] and !escapes[to]) {
                        escapes[to] = true;
                        tangleto.push(to);
                    }
                }
            }
        }

        escapes.reset();

        /**
         * If there are no outgoing edges, then we have found a dominion.
         */

        if (tangleto.empty()) {
            // dominion
            if (trace) {
                logger << "\033[1;38;5;201mdominion \033[36m" << pr << "\033[m";
                logger << " (depth " << cur_depth <<")";
                if (cur_depth != 0) {
                    LOGIC_ERROR;
                    exit(-1);
                }
#ifndef NDEBUG
                if (trace >= 2) {
                    for (const int v : tangle) {
                        logger << " \033[1;36m" << label_vertex(v) << "\033[m";
                        if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                    }
                }
#endif
                logger << std::endl;
            }
            for (const int v : tangle) {
                // if not yet added to solve queue, mark and add it
                if (S[v] == false) {
                    S[v] = true;
                    SQ.push(v);
                    dom_vector.push_back(v);
                    dom_vector.push_back(str[v]);
                }
            }
            dominions++;
            tangle.clear();
            new_tangles = true;
            continue;
        }

        /**
         * We're not a dominion, we're a tangle.
         */

#if CHECK_UNIQUE
        /** 
         * First we sort.
         */
        std::sort(tangle.begin(), tangle.end());
        int tsize = tangle.size();

        /**
         * Then we check if it already exists.
         */
        bool already_exists = false;
        for (auto &_tv : tv) {
            for (int i=0; ; i++) {
                if (i == tsize) {
                    if (_tv[2*i] == -1) already_exists = true;
                    break;
                } else if (_tv[2*i] != tangle[i]) {
                    break;
                }
            }
            if (already_exists) break;
        }
        if (already_exists) {
            if (trace >= 1) {
                logger << "\033[1;38;5;198mduplicate tangle\033[m";
#ifndef NDEBUG
                if (trace >= 2) {
                    for (int &v : tangle) {
                        logger << " \033[1;36m" << label_vertex(v) << "\033[m";
                        if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                    }
                }
#endif
                logger << std::endl;
            }
            tangle.clear();
            tangleto.clear();
            continue;
        }
#endif

        if (trace >= 1) {
            logger << "\033[1;38;5;198mnew tangle " << pr << "\033[m (" << tpr.size() << ")";
            logger << " (depth " << cur_depth <<")";
            if (trace >= 2) {
                for (const int v : tangle) {
                    logger << " \033[1;36m" << label_vertex(v) << "\033[m";
                    if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                }
            }
            logger << " with " << tangleto.size() << " escape vertices.";
            logger << std::endl;
        }

        // new tangle idx
        const int tidx = tpr.size();

        // add back links to all normal vertices in our [out]
        for (unsigned int x = 0; x < tangleto.size(); x++) tin[tangleto[x]].push_back(tidx);

        // move tangleto into vout
        int* _tout = new int[tangleto.size()+1];
        std::copy(&tangleto[0], &tangleto[tangleto.size()], _tout);
        _tout[tangleto.size()] = -1;
        tout.push_back(_tout);

        // move tangle into vv
        int* _vv = new int[tangle.size()*2+1], c=0;
        for (const int v : tangle) {
            _vv[c++] = v;
            _vv[c++] = str[v];
        }
        _vv[c] = -1;
        tv.push_back(_vv);

        // and set p to pr
        tpr.push_back(pr);

        tangles++;
        new_tangles = true;
        tangle.clear();
        tangleto.clear();
    }

    pea_S.clear();
    return new_tangles;
}